

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cc
# Opt level: O2

void __thiscall Buffer::Members::Members(Members *this,string *content)

{
  uchar *puVar1;
  
  std::__cxx11::string::string((string *)this,(string *)content);
  this->own_memory = false;
  puVar1 = (uchar *)(this->str)._M_dataplus._M_p;
  this->size = (this->str)._M_string_length;
  this->buf = puVar1;
  return;
}

Assistant:

Buffer::Members::Members(std::string&& content) :
    str(std::move(content)),
    own_memory(false),
    size(str.size()),
    buf(reinterpret_cast<unsigned char*>(str.data()))
{
}